

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfChannelList.cpp
# Opt level: O3

void __thiscall
Imf_3_4::ChannelList::layers
          (ChannelList *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *layerNames)

{
  ulong uVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  string layerName;
  allocator<char> local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&layerNames->_M_t);
  p_Var2 = (this->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(this->_map)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var3) {
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,(char *)(p_Var2 + 1),&local_51);
      uVar1 = std::__cxx11::string::rfind((char)&local_50,0x2e);
      if ((uVar1 - 1 < 0xfffffffffffffffe) && (uVar1 + 1 < local_50._M_string_length)) {
        local_50._M_dataplus._M_p[uVar1] = '\0';
        local_50._M_string_length = uVar1;
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)layerNames,&local_50);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  return;
}

Assistant:

void
ChannelList::layers (set<string>& layerNames) const
{
    layerNames.clear ();

    for (ConstIterator i = begin (); i != end (); ++i)
    {
        string layerName = i.name ();
        size_t pos       = layerName.rfind ('.');

        if (pos != string::npos && pos != 0 && pos + 1 < layerName.size ())
        {
            layerName.erase (pos);
            layerNames.insert (layerName);
        }
    }
}